

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  byte bVar4;
  sign_t sVar5;
  long lVar6;
  size_t size;
  undefined1 *puVar7;
  char __tmp;
  ulong uVar8;
  buffer<char> *c;
  size_t __len;
  size_t __n;
  ulong uVar9;
  undefined1 *puVar10;
  
  uVar9 = (ulong)(uint)specs->width;
  sVar5 = f->sign;
  uVar8 = 4 - (ulong)(sVar5 == none);
  puVar2 = *(undefined8 **)this;
  lVar6 = puVar2[2];
  __n = uVar9 - uVar8;
  if (uVar9 < uVar8 || __n == 0) {
    uVar8 = uVar8 + lVar6;
    if ((ulong)puVar2[3] < uVar8) {
      (**(code **)*puVar2)(puVar2,uVar8);
      sVar5 = f->sign;
    }
    puVar2[2] = uVar8;
    puVar7 = (undefined1 *)(lVar6 + puVar2[1]);
    if (sVar5 != none) {
      *puVar7 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)sVar5);
      puVar7 = puVar7 + 1;
    }
    pcVar3 = f->str;
    lVar6 = 0;
    do {
      puVar7[lVar6] = pcVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    return;
  }
  uVar9 = uVar9 + lVar6;
  if ((ulong)puVar2[3] < uVar9) {
    (**(code **)*puVar2)(puVar2,uVar9);
  }
  puVar2[2] = uVar9;
  puVar7 = (undefined1 *)(lVar6 + puVar2[1]);
  bVar1 = (specs->fill).data_[0];
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    uVar8 = __n >> 1 & 0x7fffffff;
    if (1 < __n) {
      memset(puVar7,(uint)bVar1,uVar8);
      puVar7 = puVar7 + uVar8;
    }
    if ((ulong)f->sign != 0) {
      *puVar7 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      puVar7 = puVar7 + 1;
    }
    pcVar3 = f->str;
    lVar6 = 0;
    do {
      puVar7[lVar6] = pcVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    __n = __n - uVar8;
    lVar6 = 3;
  }
  else {
    if (bVar4 == 2) {
      puVar10 = puVar7 + __n;
      memset(puVar7,(uint)bVar1,__n);
      if ((ulong)f->sign != 0) {
        *puVar10 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
        puVar10 = puVar10 + 1;
      }
      pcVar3 = f->str;
      lVar6 = 0;
      do {
        puVar10[lVar6] = pcVar3[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      return;
    }
    if ((ulong)f->sign != 0) {
      *puVar7 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      puVar7 = puVar7 + 1;
    }
    pcVar3 = f->str;
    lVar6 = 0;
    do {
      puVar7[lVar6] = pcVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  memset(puVar7 + lVar6,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }